

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost2015_acpkm_omac_init
              (int nid,int enc,uchar *inkey,EVP_MD_CTX *omac_ctx,uchar *outkey,uchar *kdf_seed)

{
  int iVar1;
  char *name;
  EVP_MD *type;
  EVP_PKEY *pkey;
  EVP_MD_CTX *in_RCX;
  int in_ESI;
  int in_EDI;
  uchar *in_R8;
  uchar *in_R9;
  size_t unaff_retaddr;
  EVP_PKEY *mac_key;
  EVP_MD *md;
  uchar keys [64];
  int ret;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uchar auStack_58 [8];
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  name = OBJ_nid2sn(in_EDI);
  type = EVP_get_digestbyname(name);
  if (type == (EVP_MD *)0x0) {
    iVar2 = 0;
  }
  else if ((in_ESI == 0) || (iVar1 = RAND_bytes(in_R9,8), iVar1 == 1)) {
    iVar1 = gost_kdftree2012_256
                      (in_R8,(size_t)in_R9,(uchar *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,(uchar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       CONCAT44(in_stack_fffffffffffffffc,in_EDI),unaff_retaddr);
    if (iVar1 < 1) {
      iVar2 = 0;
    }
    else {
      pkey = EVP_PKEY_new_mac_key(in_EDI,(ENGINE *)0x0,auStack_58,0x20);
      if (((pkey != (EVP_PKEY *)0x0) &&
          (iVar1 = EVP_DigestInit_ex(in_RCX,type,(ENGINE *)0x0), 0 < iVar1)) &&
         (iVar1 = EVP_DigestSignInit(in_RCX,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey), 0 < iVar1
         )) {
        *(undefined8 *)in_R8 = local_78;
        *(undefined8 *)(in_R8 + 8) = local_70;
        *(undefined8 *)(in_R8 + 0x10) = local_68;
        *(undefined8 *)(in_R8 + 0x18) = local_60;
        iVar2 = 1;
      }
      EVP_PKEY_free(pkey);
      OPENSSL_cleanse(&local_78,0x40);
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int gost2015_acpkm_omac_init(int nid, int enc, const unsigned char *inkey,
                             EVP_MD_CTX *omac_ctx,
                             unsigned char *outkey, unsigned char *kdf_seed)
{
    int ret = 0;
    unsigned char keys[64];
    const EVP_MD *md = EVP_get_digestbynid(nid);
    EVP_PKEY *mac_key;

    if (md == NULL)
        return 0;

    if (enc) {
        if (RAND_bytes(kdf_seed, 8) != 1)
            return 0;
    }

    if (gost_kdftree2012_256(keys, 64, inkey, 32,
       (const unsigned char *)"kdf tree", 8, kdf_seed, 8, 1) <= 0)
        return 0;

    mac_key = EVP_PKEY_new_mac_key(nid, NULL, keys+32, 32);

    if (mac_key == NULL)
        goto end;

    if (EVP_DigestInit_ex(omac_ctx, md, NULL) <= 0 ||
       EVP_DigestSignInit(omac_ctx, NULL, md, NULL, mac_key) <= 0)
        goto end;

    memcpy(outkey, keys, 32);

    ret = 1;
end:
    EVP_PKEY_free(mac_key);
    OPENSSL_cleanse(keys, sizeof(keys));

    return ret;
}